

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal,xmlChar *URI)

{
  uint uVar1;
  int iVar2;
  uint len;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  _xmlCatalogEntry *p_Var7;
  _xmlCatalogEntry *catal_00;
  xmlCatalogEntryPtr catal_01;
  _xmlCatalogEntry *catal_02;
  ulong uVar8;
  ulong uVar9;
  xmlCatalogEntryPtr local_1d8;
  undefined8 auStack_1c8 [51];
  
  if (catal != (xmlCatalogEntryPtr)0x0) {
    iVar2 = xmlStrncmp(URI,(xmlChar *)"urn:publicid:",0xd);
    if (iVar2 == 0) {
      pxVar5 = xmlCatalogUnWrapURN(URI);
      if (xmlDebugCatalogs == 0) {
        pxVar6 = xmlCatalogListXMLResolve(catal,pxVar5,(xmlChar *)0x0);
        if (pxVar5 == (xmlChar *)0x0) {
          return pxVar6;
        }
      }
      else {
        if (pxVar5 == (xmlChar *)0x0) {
          xmlCatalogPrintDebug("URN ID %s expanded to NULL\n",URI);
          return (xmlChar *)0x0;
        }
        xmlCatalogPrintDebug("URN ID expanded to %s\n",pxVar5);
        pxVar6 = xmlCatalogListXMLResolve(catal,pxVar5,(xmlChar *)0x0);
      }
      (*xmlFree)(pxVar5);
      return pxVar6;
    }
    do {
      if (catal->type == XML_CATA_CATALOG) {
        catal_00 = catal->children;
        if (catal_00 == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(catal);
          catal_00 = catal->children;
          if (catal_00 == (_xmlCatalogEntry *)0x0) goto LAB_00161778;
        }
        if (catal_00->depth < 0x33) {
          uVar1 = 0;
          local_1d8 = (xmlCatalogEntryPtr)0x0;
          iVar2 = 0;
          iVar4 = 0;
          p_Var7 = catal_00;
          do {
            switch(p_Var7->type) {
            case XML_CATA_NEXT_CATALOG:
              iVar2 = iVar2 + 1;
              break;
            case XML_CATA_URI:
              iVar3 = xmlStrEqual(URI,p_Var7->name);
              if (iVar3 != 0) {
                if (xmlDebugCatalogs != 0) {
                  xmlCatalogPrintDebug("Found URI match %s\n");
                }
                pxVar5 = xmlStrdup(p_Var7->URL);
                goto LAB_00161773;
              }
              break;
            case XML_CATA_REWRITE_URI:
              len = xmlStrlen(p_Var7->name);
              if (((int)uVar1 < (int)len) && (iVar3 = xmlStrncmp(URI,p_Var7->name,len), iVar3 == 0))
              {
                local_1d8 = p_Var7;
                uVar1 = len;
              }
              break;
            case XML_CATA_DELEGATE_URI:
              pxVar5 = p_Var7->name;
              iVar3 = xmlStrlen(pxVar5);
              iVar3 = xmlStrncmp(URI,pxVar5,iVar3);
              iVar4 = iVar4 + (uint)(iVar3 == 0);
            }
            p_Var7 = p_Var7->next;
          } while (p_Var7 != (_xmlCatalogEntry *)0x0);
          if (local_1d8 == (xmlCatalogEntryPtr)0x0) {
            if (iVar4 != 0) {
              uVar9 = 0;
              goto LAB_00161817;
            }
            if (iVar2 != 0) {
              do {
                if (catal_00->type == XML_CATA_NEXT_CATALOG) {
                  catal_01 = catal_00->children;
                  if (catal_01 == (xmlCatalogEntryPtr)0x0) {
                    xmlFetchXMLCatalogFile(catal_00);
                    catal_01 = catal_00->children;
                    if (catal_01 == (xmlCatalogEntryPtr)0x0) goto LAB_0016173d;
                  }
                  pxVar5 = xmlCatalogListXMLResolveURI(catal_01,URI);
                  if (pxVar5 != (xmlChar *)0x0) {
                    return pxVar5;
                  }
                }
LAB_0016173d:
                catal_00 = catal_00->next;
              } while (catal_00 != (_xmlCatalogEntry *)0x0);
            }
          }
          else {
            if (xmlDebugCatalogs != 0) {
              xmlCatalogPrintDebug("Using rewriting rule %s\n");
            }
            pxVar5 = xmlStrdup(local_1d8->URL);
            if (pxVar5 != (xmlChar *)0x0) {
              pxVar5 = xmlStrcat(pxVar5,URI + uVar1);
LAB_00161773:
              if (pxVar5 != (xmlChar *)0x0) {
                return pxVar5;
              }
            }
          }
        }
        else {
          xmlCatalogErr(catal_00,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",
                        catal_00->name,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
LAB_00161778:
      catal = catal->next;
    } while (catal != (_xmlCatalogEntry *)0x0);
  }
  return (xmlChar *)0x0;
LAB_00161817:
  iVar2 = (int)uVar9;
  p_Var7 = catal_00;
  while ((p_Var7->type == XML_CATA_DELEGATE_URI || (p_Var7->type == XML_CATA_DELEGATE_SYSTEM))) {
    pxVar5 = p_Var7->name;
    iVar4 = xmlStrlen(pxVar5);
    iVar4 = xmlStrncmp(URI,pxVar5,iVar4);
    if (iVar4 != 0) break;
    if (iVar2 < 1) goto LAB_00161887;
    uVar8 = 0;
    while (iVar4 = xmlStrEqual(p_Var7->URL,(xmlChar *)auStack_1c8[uVar8]), iVar4 == 0) {
      uVar8 = uVar8 + 1;
      if (uVar9 == uVar8) {
        catal_00 = p_Var7;
        if (0x31 < iVar2) goto LAB_00161896;
        goto LAB_00161887;
      }
    }
    p_Var7 = p_Var7->next;
    if (p_Var7 == (_xmlCatalogEntry *)0x0) {
      return (xmlChar *)0xffffffffffffffff;
    }
  }
  goto LAB_001618dc;
LAB_00161887:
  uVar9 = (ulong)(iVar2 + 1);
  auStack_1c8[iVar2] = catal_00->URL;
LAB_00161896:
  catal_02 = catal_00->children;
  p_Var7 = catal_00;
  if (catal_02 == (_xmlCatalogEntry *)0x0) {
    xmlFetchXMLCatalogFile(catal_00);
    catal_02 = catal_00->children;
    if (catal_02 == (_xmlCatalogEntry *)0x0) goto LAB_001618dc;
  }
  if (xmlDebugCatalogs != 0) {
    xmlCatalogPrintDebug("Trying URI delegate %s\n",catal_00->URL);
    catal_02 = catal_00->children;
  }
  pxVar5 = xmlCatalogListXMLResolveURI(catal_02,URI);
  if (pxVar5 != (xmlChar *)0x0) {
    return pxVar5;
  }
LAB_001618dc:
  catal_00 = p_Var7->next;
  if (catal_00 == (_xmlCatalogEntry *)0x0) {
    return (xmlChar *)0xffffffffffffffff;
  }
  goto LAB_00161817;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;

    if (catal == NULL)
        return(NULL);
    if (URI == NULL)
	return(NULL);

    if (!xmlStrncmp(URI, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(URI);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"URN ID %s expanded to NULL\n", URI);
	    else
		xmlCatalogPrintDebug(
			"URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	if (urnID != NULL)
	    xmlFree(urnID);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolveURI(catal->children, URI);
		if (ret != NULL)
		    return(ret);
	    }
	}
	catal = catal->next;
    }
    return(ret);
}